

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.h
# Opt level: O0

void __thiscall
pbrt::syntactic::BasicLexer<pbrt::syntactic::MappedFile>::CharBuffer::operator<<
          (CharBuffer *this,char c)

{
  value_type *in_RDI;
  vector<char,_std::allocator<char>_> *unaff_retaddr;
  
  std::vector<char,_std::allocator<char>_>::push_back(unaff_retaddr,in_RDI);
  return;
}

Assistant:

void operator<<(char c) { data_.push_back(c); }